

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Cos::~Cos(Cos *this)

{
  Cos *this_local;
  
  ~Cos(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

Cos			(void) : TrigFunc("cos", deCos, -1.0, 1.0) {}